

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this,
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *other)

{
  size_t sVar1;
  float *pfVar2;
  int i_1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar3;
  size_t i;
  size_t sVar4;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar5;
  
  if (this != other) {
    this->nStored = 0;
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      pfVar2 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = pfVar2;
      sVar1 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar1;
      sVar1 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar1;
      sVar1 = this->nStored;
      if ((sVar1 != 0) && (this->ptr == (float *)0x0)) {
        for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
          *(undefined4 *)((long)&this->field_2 + sVar4 * 4) =
               *(undefined4 *)((long)&other->field_2 + sVar4 * 4);
        }
        other->nStored = sVar1;
      }
    }
    else {
      reserve(this,other->nStored);
      sVar1 = other->nStored;
      paVar3 = &this->field_2;
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)this->ptr !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)0x0) {
        paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)this->ptr;
      }
      paVar5 = &other->field_2;
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)other->ptr !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)0x0) {
        paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)other->ptr;
      }
      for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
        paVar3->fixed[sVar4] = paVar5->fixed[sVar4];
      }
      this->nStored = sVar1;
    }
  }
  return this;
}

Assistant:

InlinedVector &operator=(InlinedVector &&other) {
        if (this == &other)
            return *this;

        clear();
        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
            if (nStored > 0 && ptr == nullptr) {
                for (int i = 0; i < nStored; ++i)
                    alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
                other.nStored = nStored;  // so that dtors run...
            }
        } else {
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(begin() + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }